

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model.cpp
# Opt level: O2

void __thiscall
llm_build_baichuan::llm_build_baichuan
          (llm_build_baichuan *this,llama_model *model,llm_graph_params *params,ggml_cgraph *gf)

{
  uint uVar1;
  llama_hparams *plVar2;
  pointer plVar3;
  llm_graph_input_attn_kv_unified *inp;
  ggml_tensor *pgVar4;
  ggml_tensor *pgVar5;
  ggml_tensor *pgVar6;
  char *pcVar7;
  undefined8 uVar8;
  long lVar9;
  int il;
  long lVar10;
  undefined8 in_stack_ffffffffffffff48;
  undefined4 uVar11;
  ggml_tensor *local_60;
  ggml_tensor *local_58;
  
  llm_graph_context::llm_graph_context(&this->super_llm_graph_context,params);
  plVar2 = (this->super_llm_graph_context).hparams;
  uVar1 = plVar2->n_embd_head_v;
  if (uVar1 == plVar2->n_embd_head_k) {
    if (uVar1 == plVar2->n_rot) {
      local_58 = llm_graph_context::build_inp_embd(&this->super_llm_graph_context,model->tok_embd);
      if (model->type == LLM_TYPE_7B) {
        local_60 = llm_graph_context::build_inp_pos(&this->super_llm_graph_context);
      }
      else {
        local_60 = (ggml_tensor *)0x0;
      }
      inp = llm_graph_context::build_attn_inp_kv_unified(&this->super_llm_graph_context);
      lVar9 = 0;
      lVar10 = 0;
      do {
        uVar11 = (undefined4)((ulong)in_stack_ffffffffffffff48 >> 0x20);
        if ((this->super_llm_graph_context).n_layer <= lVar10) {
          pgVar4 = llm_graph_context::build_norm
                             (&this->super_llm_graph_context,local_58,model->output_norm,
                              (ggml_tensor *)0x0,LLM_NORM_RMS,-1);
          llm_graph_context::cb(&this->super_llm_graph_context,pgVar4,"result_norm",-1);
          ((this->super_llm_graph_context).res._M_t.
           super___uniq_ptr_impl<llm_graph_result,_std::default_delete<llm_graph_result>_>._M_t.
           super__Tuple_impl<0UL,_llm_graph_result_*,_std::default_delete<llm_graph_result>_>.
           super__Head_base<0UL,_llm_graph_result_*,_false>._M_head_impl)->t_embd = pgVar4;
          pgVar4 = llm_graph_context::build_lora_mm
                             (&this->super_llm_graph_context,model->output,pgVar4);
          llm_graph_context::cb(&this->super_llm_graph_context,pgVar4,"result_output",-1);
          ((this->super_llm_graph_context).res._M_t.
           super___uniq_ptr_impl<llm_graph_result,_std::default_delete<llm_graph_result>_>._M_t.
           super__Tuple_impl<0UL,_llm_graph_result_*,_std::default_delete<llm_graph_result>_>.
           super__Head_base<0UL,_llm_graph_result_*,_false>._M_head_impl)->t_logits = pgVar4;
          ggml_build_forward_expand(gf,pgVar4);
          return;
        }
        il = (int)lVar10;
        pgVar4 = llm_graph_context::build_norm
                           (&this->super_llm_graph_context,local_58,
                            *(ggml_tensor **)
                             ((long)&((model->layers).
                                      super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                      _M_impl.super__Vector_impl_data._M_start)->attn_norm + lVar9),
                            (ggml_tensor *)0x0,LLM_NORM_RMS,il);
        llm_graph_context::cb(&this->super_llm_graph_context,pgVar4,"attn_norm",il);
        pgVar5 = llm_graph_context::build_lora_mm
                           (&this->super_llm_graph_context,
                            *(ggml_tensor **)
                             ((long)&((model->layers).
                                      super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                      _M_impl.super__Vector_impl_data._M_start)->wq + lVar9),pgVar4)
        ;
        llm_graph_context::cb(&this->super_llm_graph_context,pgVar5,"Qcur",il);
        pgVar6 = llm_graph_context::build_lora_mm
                           (&this->super_llm_graph_context,
                            *(ggml_tensor **)
                             ((long)&((model->layers).
                                      super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                      _M_impl.super__Vector_impl_data._M_start)->wk + lVar9),pgVar4)
        ;
        llm_graph_context::cb(&this->super_llm_graph_context,pgVar6,"Kcur",il);
        pgVar4 = llm_graph_context::build_lora_mm
                           (&this->super_llm_graph_context,
                            *(ggml_tensor **)
                             ((long)&((model->layers).
                                      super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                      _M_impl.super__Vector_impl_data._M_start)->wv + lVar9),pgVar4)
        ;
        llm_graph_context::cb(&this->super_llm_graph_context,pgVar4,"Vcur",il);
        pgVar5 = (ggml_tensor *)
                 ggml_reshape_3d((this->super_llm_graph_context).ctx0,pgVar5,uVar1,
                                 (this->super_llm_graph_context).n_head,
                                 (long)(this->super_llm_graph_context).n_tokens);
        pgVar6 = (ggml_tensor *)
                 ggml_reshape_3d((this->super_llm_graph_context).ctx0,pgVar6,uVar1,
                                 (this->super_llm_graph_context).n_head_kv,
                                 (long)(this->super_llm_graph_context).n_tokens);
        pgVar4 = (ggml_tensor *)
                 ggml_reshape_3d((this->super_llm_graph_context).ctx0,pgVar4,uVar1,
                                 (this->super_llm_graph_context).n_head_kv);
        if (model->type == LLM_TYPE_7B) {
          pgVar5 = (ggml_tensor *)
                   ggml_rope_ext((this->super_llm_graph_context).freq_base,
                                 (this->super_llm_graph_context).freq_scale,
                                 (this->super_llm_graph_context).ext_factor,
                                 (this->super_llm_graph_context).attn_factor,
                                 (this->super_llm_graph_context).beta_fast,
                                 (this->super_llm_graph_context).beta_slow,
                                 (this->super_llm_graph_context).ctx0,pgVar5,local_60,0,
                                 (int)(this->super_llm_graph_context).n_rot,
                                 (this->super_llm_graph_context).rope_type,
                                 CONCAT44(uVar11,(this->super_llm_graph_context).n_ctx_orig));
          pgVar6 = (ggml_tensor *)
                   ggml_rope_ext((this->super_llm_graph_context).freq_base,
                                 (this->super_llm_graph_context).freq_scale,
                                 (this->super_llm_graph_context).ext_factor,
                                 (this->super_llm_graph_context).attn_factor,
                                 (this->super_llm_graph_context).beta_fast,
                                 (this->super_llm_graph_context).beta_slow,
                                 (this->super_llm_graph_context).ctx0,pgVar6,local_60,0,
                                 (int)(this->super_llm_graph_context).n_rot,
                                 (this->super_llm_graph_context).rope_type,
                                 (this->super_llm_graph_context).n_ctx_orig);
        }
        else if (model->type != LLM_TYPE_13B) {
          ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model.cpp"
                     ,0x12ff,"fatal error");
        }
        llm_graph_context::cb(&this->super_llm_graph_context,pgVar5,"Qcur",il);
        llm_graph_context::cb(&this->super_llm_graph_context,pgVar6,"Kcur",il);
        llm_graph_context::cb(&this->super_llm_graph_context,pgVar4,"Vcur",il);
        pgVar4 = llm_graph_context::build_attn
                           (&this->super_llm_graph_context,inp,gf,
                            *(ggml_tensor **)
                             ((long)&((model->layers).
                                      super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                      _M_impl.super__Vector_impl_data._M_start)->wo + lVar9),
                            (ggml_tensor *)0x0,pgVar5,pgVar6,pgVar4,(ggml_tensor *)0x0,
                            (ggml_tensor *)0x0,1.0 / SQRT((float)uVar1),il);
        if (lVar10 == (this->super_llm_graph_context).n_layer + -1) {
          pgVar5 = llm_graph_context::build_inp_out_ids(&this->super_llm_graph_context);
          pgVar4 = (ggml_tensor *)ggml_get_rows((this->super_llm_graph_context).ctx0,pgVar4,pgVar5);
          local_58 = (ggml_tensor *)
                     ggml_get_rows((this->super_llm_graph_context).ctx0,local_58,pgVar5);
        }
        pgVar4 = (ggml_tensor *)ggml_add((this->super_llm_graph_context).ctx0,pgVar4,local_58);
        llm_graph_context::cb(&this->super_llm_graph_context,pgVar4,"ffn_inp",il);
        pgVar5 = llm_graph_context::build_norm
                           (&this->super_llm_graph_context,pgVar4,
                            *(ggml_tensor **)
                             ((long)&((model->layers).
                                      super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                      _M_impl.super__Vector_impl_data._M_start)->ffn_norm + lVar9),
                            (ggml_tensor *)0x0,LLM_NORM_RMS,il);
        llm_graph_context::cb(&this->super_llm_graph_context,pgVar5,"ffn_norm",il);
        plVar3 = (model->layers).super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        in_stack_ffffffffffffff48 = 0;
        pgVar5 = llm_graph_context::build_ffn
                           (&this->super_llm_graph_context,pgVar5,
                            *(ggml_tensor **)((long)&plVar3->ffn_up + lVar9),(ggml_tensor *)0x0,
                            (ggml_tensor *)0x0,*(ggml_tensor **)((long)&plVar3->ffn_gate + lVar9),
                            (ggml_tensor *)0x0,(ggml_tensor *)0x0,
                            *(ggml_tensor **)((long)&plVar3->ffn_down + lVar9),(ggml_tensor *)0x0,
                            (ggml_tensor *)0x0,(ggml_tensor *)0x0,LLM_FFN_SILU,LLM_FFN_PAR,il);
        llm_graph_context::cb(&this->super_llm_graph_context,pgVar5,"ffn_out",il);
        pgVar4 = (ggml_tensor *)ggml_add((this->super_llm_graph_context).ctx0,pgVar5,pgVar4);
        local_58 = llm_graph_context::build_cvec(&this->super_llm_graph_context,pgVar4,il);
        llm_graph_context::cb(&this->super_llm_graph_context,local_58,"l_out",il);
        lVar10 = lVar10 + 1;
        lVar9 = lVar9 + 0x4f0;
      } while( true );
    }
    pcVar7 = "n_embd_head == hparams.n_rot";
    uVar8 = 0x12cc;
  }
  else {
    pcVar7 = "n_embd_head == hparams.n_embd_head_k";
    uVar8 = 0x12cb;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model.cpp"
             ,uVar8,"GGML_ASSERT(%s) failed",pcVar7);
}

Assistant:

llm_build_baichuan(const llama_model & model, const llm_graph_params & params, ggml_cgraph * gf) : llm_graph_context(params) {
        const int64_t n_embd_head = hparams.n_embd_head_v;

        GGML_ASSERT(n_embd_head == hparams.n_embd_head_k);
        GGML_ASSERT(n_embd_head == hparams.n_rot);

        ggml_tensor * cur;
        ggml_tensor * inpL;

        inpL = build_inp_embd(model.tok_embd);

        // inp_pos - contains the positions
        ggml_tensor * inp_pos = model.type == LLM_TYPE_7B ? build_inp_pos() : nullptr;

        auto * inp_attn = build_attn_inp_kv_unified();

        for (int il = 0; il < n_layer; ++il) {
            ggml_tensor * inpSA = inpL;

            cur = build_norm(inpL,
                    model.layers[il].attn_norm, NULL,
                    LLM_NORM_RMS, il);
            cb(cur, "attn_norm", il);

            // self-attention
            {
                ggml_tensor * Qcur = build_lora_mm(model.layers[il].wq, cur);
                cb(Qcur, "Qcur", il);

                ggml_tensor * Kcur = build_lora_mm(model.layers[il].wk, cur);
                cb(Kcur, "Kcur", il);

                ggml_tensor * Vcur = build_lora_mm(model.layers[il].wv, cur);
                cb(Vcur, "Vcur", il);

                Qcur = ggml_reshape_3d(ctx0, Qcur, n_embd_head, n_head,    n_tokens);
                Kcur = ggml_reshape_3d(ctx0, Kcur, n_embd_head, n_head_kv, n_tokens);
                Vcur = ggml_reshape_3d(ctx0, Vcur, n_embd_head, n_head_kv, n_tokens);

                switch (model.type) {
                    case LLM_TYPE_7B:
                        Qcur = ggml_rope_ext(
                                ctx0, Qcur, inp_pos, nullptr,
                                n_rot, rope_type, n_ctx_orig, freq_base, freq_scale,
                                ext_factor, attn_factor, beta_fast, beta_slow
                                );
                        Kcur = ggml_rope_ext(
                                ctx0, Kcur, inp_pos, nullptr,
                                n_rot, rope_type, n_ctx_orig, freq_base, freq_scale,
                                ext_factor, attn_factor, beta_fast, beta_slow
                                );
                        break;
                    case LLM_TYPE_13B:
                        break;
                    default:
                        GGML_ABORT("fatal error");
                }

                cb(Qcur, "Qcur", il);
                cb(Kcur, "Kcur", il);
                cb(Vcur, "Vcur", il);

                cur = build_attn(inp_attn, gf,
                        model.layers[il].wo, NULL,
                        Qcur, Kcur, Vcur, nullptr, nullptr, 1.0f/sqrtf(float(n_embd_head)), il);
            }

            if (il == n_layer - 1) {
                // skip computing output for unused tokens
                ggml_tensor * inp_out_ids = build_inp_out_ids();
                cur   = ggml_get_rows(ctx0,   cur, inp_out_ids);
                inpSA = ggml_get_rows(ctx0, inpSA, inp_out_ids);
            }

            ggml_tensor * ffn_inp = ggml_add(ctx0, cur, inpSA);
            cb(ffn_inp, "ffn_inp", il);

            // feed-forward network
            {
                cur = build_norm(ffn_inp,
                        model.layers[il].ffn_norm, NULL,
                        LLM_NORM_RMS, il);
                cb(cur, "ffn_norm", il);

                cur = build_ffn(cur,
                        model.layers[il].ffn_up,   NULL, NULL,
                        model.layers[il].ffn_gate, NULL, NULL,
                        model.layers[il].ffn_down, NULL, NULL,
                        NULL,
                        LLM_FFN_SILU, LLM_FFN_PAR, il);
                cb(cur, "ffn_out", il);
            }

            cur = ggml_add(ctx0, cur, ffn_inp);

            cur = build_cvec(cur, il);
            cb(cur, "l_out", il);

            // input for next layer
            inpL = cur;
        }

        cur = inpL;

        cur = build_norm(cur,
                model.output_norm, NULL,
                LLM_NORM_RMS, -1);

        cb(cur, "result_norm", -1);
        res->t_embd = cur;

        // lm_head
        cur = build_lora_mm(model.output, cur);

        cb(cur, "result_output", -1);
        res->t_logits = cur;

        ggml_build_forward_expand(gf, cur);
    }